

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_blob_close(sqlite3_blob *pBlob)

{
  sqlite3 *db_00;
  sqlite3 *db;
  int rc;
  Incrblob *p;
  sqlite3_blob *pBlob_local;
  
  if (pBlob == (sqlite3_blob *)0x0) {
    db._4_4_ = 0;
  }
  else {
    db_00 = *(sqlite3 **)(pBlob + 0x20);
    sqlite3_mutex_enter(db_00->mutex);
    db._4_4_ = sqlite3_finalize(*(sqlite3_stmt **)(pBlob + 0x18));
    sqlite3DbFree(db_00,pBlob);
    sqlite3_mutex_leave(db_00->mutex);
  }
  return db._4_4_;
}

Assistant:

SQLITE_API int sqlite3_blob_close(sqlite3_blob *pBlob){
  Incrblob *p = (Incrblob *)pBlob;
  int rc;
  sqlite3 *db;

  if( p ){
    db = p->db;
    sqlite3_mutex_enter(db->mutex);
    rc = sqlite3_finalize(p->pStmt);
    sqlite3DbFree(db, p);
    sqlite3_mutex_leave(db->mutex);
  }else{
    rc = SQLITE_OK;
  }
  return rc;
}